

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void lys_when_free(ly_ctx *ctx,lys_when *w,_func_void_lys_node_ptr_void_ptr *private_destructor)

{
  if (w != (lys_when *)0x0) {
    lys_extension_instances_free(ctx,w->ext,(uint)w->ext_size,private_destructor);
    lydict_remove(ctx,w->cond);
    lydict_remove(ctx,w->dsc);
    lydict_remove(ctx,w->ref);
    free(w);
    return;
  }
  return;
}

Assistant:

void
lys_when_free(struct ly_ctx *ctx, struct lys_when *w,
              void (*private_destructor)(const struct lys_node *node, void *priv))
{
    if (!w) {
        return;
    }

    lys_extension_instances_free(ctx, w->ext, w->ext_size, private_destructor);
    lydict_remove(ctx, w->cond);
    lydict_remove(ctx, w->dsc);
    lydict_remove(ctx, w->ref);

    free(w);
}